

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O1

void map2json_createJsonString(csafestring_t *buffer,map2json_tree_t *tree)

{
  long lVar1;
  s_map2json_tree *tree_00;
  
  while( true ) {
    if (tree == (map2json_tree_t *)0x0) {
      return;
    }
    if (tree->key != (char *)0x0) {
      safe_strchrappend(buffer,'\"');
      safe_strcat(buffer,tree->key);
      safe_strchrappend(buffer,'\"');
      safe_strchrappend(buffer,':');
    }
    if (tree->type == JSMN_OBJECT) {
      safe_strchrappend(buffer,'{');
      map2json_createJsonString(buffer,tree->children);
      safe_strchrappend(buffer,'}');
    }
    if (tree->type == JSMN_ARRAY) {
      safe_strchrappend(buffer,'[');
      if (0 < tree->maxArrayId) {
        lVar1 = 0;
        do {
          for (tree_00 = tree->arrayObjects; tree_00 != (map2json_tree_t *)0x0;
              tree_00 = tree_00->arrayObjects) {
            if (tree_00->arrayId == lVar1) {
              map2json_createJsonString(buffer,tree_00);
            }
          }
          if (lVar1 < tree->maxArrayId + -1) {
            safe_strchrappend(buffer,',');
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 < tree->maxArrayId);
      }
      safe_strchrappend(buffer,']');
    }
    if (tree->type - JSMN_STRING < 2) {
      if (tree->type == JSMN_STRING) {
        safe_strchrappend(buffer,'\"');
      }
      safe_strcat(buffer,tree->value);
      if (tree->type == JSMN_STRING) {
        safe_strchrappend(buffer,'\"');
      }
    }
    if (tree->next == (s_map2json_tree *)0x0) break;
    safe_strchrappend(buffer,',');
    tree = tree->next;
  }
  return;
}

Assistant:

static void map2json_createJsonString(csafestring_t *buffer, map2json_tree_t *tree) {
	DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... ", buffer->data);

	if ( tree == NULL ) {
		DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... DONE", buffer->data);
		return;
	}

	if ( tree->key != NULL ) {
		safe_strchrappend(buffer, '\"');
		safe_strcat(buffer, tree->key);
		safe_strchrappend(buffer, '\"');
		safe_strchrappend(buffer, ':');
	}

	if ( tree->type == JSMN_OBJECT ) {
		safe_strchrappend(buffer, '{');
		map2json_createJsonString(buffer, tree->children);
		safe_strchrappend(buffer, '}');
	}

	if ( tree->type == JSMN_ARRAY ) {
		map2json_createJsonStringArray(buffer, tree);
	}

	if ( tree->type == JSMN_PRIMITIVE || tree->type == JSMN_STRING ) {
		if ( tree->type == JSMN_STRING ) {
			safe_strchrappend(buffer, '\"');
		}
		safe_strcat(buffer, tree->value);
		if ( tree->type == JSMN_STRING ) {
			safe_strchrappend(buffer, '\"');
		}
	}

	if ( tree->next != NULL ) {
		safe_strchrappend(buffer, ',');
		map2json_createJsonString(buffer, tree->next);
	}
	DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... DONE", buffer->data);
}